

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

DynamicObject * __thiscall
JsrtDebugManager::SetBreakPoint
          (JsrtDebugManager *this,ScriptContext *scriptContext,Utf8SourceInfo *utf8SourceInfo,
          UINT lineNumber,UINT columnNumber)

{
  ScriptContext *scriptContext_00;
  StatementLocation statement_00;
  StatementLocation statement_01;
  Interval scriptContext_01;
  HRESULT HVar1;
  uint32 uVar2;
  charcount_t cVar3;
  BOOL BVar4;
  DebugDocument *this_00;
  LineOffsetCache *this_01;
  BreakpointProbe *this_02;
  JsrtDebugDocumentManager *this_03;
  DynamicObject *pDVar5;
  charcount_t local_54;
  undefined1 auStack_50 [4];
  charcount_t byteOffset;
  StatementLocation statement;
  
  statement.bytecodeSpan = (Interval)scriptContext;
  this_00 = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if ((this_00 != (DebugDocument *)0x0) &&
     (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(utf8SourceInfo), -1 < HVar1)) {
    this_01 = Js::Utf8SourceInfo::GetLineOffsetCache(utf8SourceInfo);
    uVar2 = Js::LineOffsetCache::GetLineCount(this_01);
    if (lineNumber < uVar2) {
      local_54 = 0;
      cVar3 = Js::LineOffsetCache::GetCharacterOffsetForLine
                        ((utf8SourceInfo->m_lineOffsetCache).ptr,lineNumber,&local_54);
      statement.function = (FunctionBody *)0x0;
      statement.statement.begin = 0;
      statement.statement.end = 0;
      BVar4 = Js::DebugDocument::GetStatementLocation
                        (this_00,cVar3 + columnNumber + 1,(StatementLocation *)auStack_50);
      if (BVar4 != 0) {
        statement_00.statement = (Interval)statement.function;
        statement_00.function = _auStack_50;
        statement_00.bytecodeSpan = statement.statement;
        this_02 = Js::DebugDocument::FindBreakpoint(this_00,statement_00);
        if (this_02 == (BreakpointProbe *)0x0) {
          statement_01.statement = (Interval)statement.function;
          statement_01.function = _auStack_50;
          statement_01.bytecodeSpan = statement.statement;
          this_02 = Js::DebugDocument::SetBreakPoint(this_00,statement_01,BREAKPOINT_ENABLED);
          if (this_02 == (BreakpointProbe *)0x0) {
            return (DynamicObject *)0x0;
          }
          this_03 = GetDebugDocumentManager(this);
          JsrtDebugDocumentManager::AddDocument(this_03,this_02->breakpointId,this_00);
        }
        Js::BreakpointProbe::GetStatementLocation(this_02,(StatementLocation *)auStack_50);
        scriptContext_01 = statement.bytecodeSpan;
        scriptContext_00 = (this_00->utf8SourceInfo->m_scriptContext).ptr;
        pDVar5 = Js::JavascriptLibrary::CreateObject
                           (*(JavascriptLibrary **)((long)statement.bytecodeSpan + 8),false,0);
        pDVar5 = (DynamicObject *)Js::CrossSite::MarshalVar(scriptContext_00,pDVar5,false);
        JsrtDebugUtils::AddPropertyToObject
                  (pDVar5,(JsrtDebugPropertyId)0x1,this_02->breakpointId,
                   (ScriptContext *)scriptContext_01);
        JsrtDebugUtils::AddLineColumnToObject(pDVar5,_auStack_50,statement.statement.begin);
        JsrtDebugUtils::AddScriptIdToObject(pDVar5,utf8SourceInfo);
        return pDVar5;
      }
    }
  }
  return (DynamicObject *)0x0;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::SetBreakPoint(Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber)
{
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if (debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if (!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        if (probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint(statement, BREAKPOINT_ENABLED);

            if(probe == nullptr)
            {
                return nullptr;
            }

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        probe->GetStatementLocation(&statement);

        Js::DynamicObject* bpObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(debugDocument->GetUtf8SourceInfo()->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, probe->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, statement.function, statement.bytecodeSpan.begin);
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        return bpObject;
    }

    return nullptr;
}